

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrift_tools.hpp
# Opt level: O0

void __thiscall duckdb::ReadAheadBuffer::Prefetch(ReadAheadBuffer *this)

{
  bool bVar1;
  reference this_00;
  BufferHandle *this_01;
  BufferHandle *pBVar2;
  runtime_error *this_02;
  ReadHead *read_head;
  iterator __end2;
  iterator __begin2;
  list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *__range2;
  idx_t in_stack_000000e0;
  idx_t in_stack_000000e8;
  data_ptr_t *in_stack_000000f0;
  CachingFileHandle *in_stack_000000f8;
  BufferHandle *in_stack_ffffffffffffff98;
  CachingFileHandle *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::begin
                 ((list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)
                  in_stack_ffffffffffffff98);
  local_20._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::end
                 ((list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)
                  in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = ::std::operator!=(local_18,&local_20);
    if (!bVar1) {
      return;
    }
    this_00 = ::std::_List_iterator<duckdb::ReadHead>::operator*
                        ((_List_iterator<duckdb::ReadHead> *)0x21dc6e8);
    this_01 = (BufferHandle *)ReadHead::GetEnd(this_00);
    pBVar2 = (BufferHandle *)CachingFileHandle::GetFileSize(in_stack_ffffffffffffffc8);
    if (pBVar2 < this_01) break;
    CachingFileHandle::Read(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0)
    ;
    BufferHandle::operator=(this_01,in_stack_ffffffffffffff98);
    BufferHandle::~BufferHandle(this_01);
    this_00->data_isset = true;
    ::std::_List_iterator<duckdb::ReadHead>::operator++(local_18);
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_02,"Prefetch registered requested for bytes outside file");
  __cxa_throw(this_02,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Prefetch() {
		for (auto &read_head : read_heads) {
			if (read_head.GetEnd() > file_handle.GetFileSize()) {
				throw std::runtime_error("Prefetch registered requested for bytes outside file");
			}
			read_head.buffer_handle = file_handle.Read(read_head.buffer_ptr, read_head.size, read_head.location);
			read_head.data_isset = true;
		}
	}